

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_curse_item(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t curse_index;
  wchar_t power;
  object *obj;
  wchar_t update;
  char s [80];
  
  wVar2 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if (wVar2 != L'\0') {
    _Var1 = get_item(&obj,"Change curse on which item? ","You have nothing to change.",cmd->code,
                     (item_tester)0x0,L'\x0f');
    if (!_Var1) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",obj);
  }
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"index",&curse_index);
  if (wVar2 != L'\0') {
    strnfmt(s,0x50,"0");
    _Var1 = get_string("Enter curse name or index: ",s,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(s,&curse_index);
    if (!_Var1) {
      curse_index = lookup_curse(s);
    }
    cmd_set_arg_number((command_conflict *)cmd,"index",curse_index);
  }
  if ((L'\0' < curse_index) && ((uint)curse_index < (uint)z_info->curse_max)) {
    wVar2 = cmd_get_arg_number((command_conflict *)cmd,"power",&power);
    if (wVar2 != L'\0') {
      strnfmt(s,0x50,"0");
      _Var1 = get_string("Enter curse power (0 removes): ",s,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(s,&power);
      if (!_Var1) {
        return;
      }
      cmd_set_arg_number((command_conflict *)cmd,"power",power);
    }
    if (L'\xffffffff' < power) {
      if (power == L'\0') {
        _Var1 = remove_object_curse(obj,curse_index,false);
        if (!_Var1) {
          return;
        }
      }
      else {
        append_object_curse(obj,curse_index,power);
      }
      update = L'\0';
      wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"update",&update);
      if (wVar2 == L'\0' && update == L'\0') {
        wiz_play_item_notify_changed();
      }
      else {
        wiz_play_item_standard_upkeep(player,obj);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_curse_item(struct command *cmd)
{
	struct object *obj;
	int curse_index, power;
	char s[80];
	int update;

	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Change curse on which item? ",
				"You have nothing to change.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Get curse. */
	if (cmd_get_arg_number(cmd, "index", &curse_index) != CMD_OK) {
		strnfmt(s, sizeof(s), "0");
		if (!get_string("Enter curse name or index: ",
				s, sizeof(s))) return;
		if (!get_int_from_string(s, &curse_index)) {
			curse_index = lookup_curse(s);
		}
		cmd_set_arg_number(cmd, "index", curse_index);
	}
	if (curse_index <= 0 || curse_index >= z_info->curse_max) {
		return;
	}

	/* Get power for curse. */
	if (cmd_get_arg_number(cmd, "power", &power) != CMD_OK) {
		strnfmt(s, sizeof(s), "0");
		if (!get_string("Enter curse power (0 removes): ", s,
				sizeof(s)) || !get_int_from_string(s, &power)) {
			return;
		}
		cmd_set_arg_number(cmd, "power", power);
	}
	if (power < 0) {
		return;
	}

	/* Apply. */
	if (power) {
		append_object_curse(obj, curse_index, power);
	} else if (!remove_object_curse(obj, curse_index, false)) {
		return;
	}

	update = 0;
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK || update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}
}